

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O3

uint16 get16bits11bits(int base,int table,int mul,int index)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  uVar2 = index + 3;
  if (-1 < index) {
    uVar2 = index;
  }
  uVar3 = -alphaBase[table][((uVar2 & 0xfffffffc) - index) + 3];
  if ((index & 0xfffffffcU) == 4) {
    uVar3 = ~alphaBase[table][((uVar2 & 0xfffffffc) - index) + 3];
  }
  iVar4 = 1;
  if (mul != 0) {
    iVar4 = mul * 8;
  }
  iVar1 = -(iVar4 * uVar3);
  if ((index & 0xfffffffcU) == 4) {
    iVar1 = iVar4 * uVar3;
  }
  uVar3 = iVar1 + base * 8 + 4;
  uVar2 = 0;
  if (0 < (int)uVar3) {
    uVar2 = uVar3;
  }
  if (0x7fe < (int)uVar2) {
    uVar2 = 0x7ff;
  }
  return (ushort)(uVar2 >> 6) | (ushort)(uVar2 << 5);
}

Assistant:

uint16 get16bits11bits(int base, int table, int mul, int index) 
{
	int elevenbase = base*8+4;

	//i want the positive value here
	int tabVal = -alphaBase[table][3-index%4]-1;
	//and the sign, please
	int sign = 1-(index/4);
	
	if(sign)
		tabVal=tabVal+1;
	int elevenTabVal = tabVal*8;

	if(mul!=0)
		elevenTabVal*=mul;
	else
		elevenTabVal/=8;

	if(sign)
		elevenTabVal=-elevenTabVal;

	//calculate sum
	int elevenbits = elevenbase+elevenTabVal;

	//clamp..
	if(elevenbits>=256*8)
		elevenbits=256*8-1;
	else if(elevenbits<0)
		elevenbits=0;
	//elevenbits now contains the 11 bit alpha value as defined in the spec.

	//extend to 16 bits before returning, since we don't have any good 11-bit file formats.
	uint16 sixteenbits = (elevenbits<<5)+(elevenbits>>6);

	return sixteenbits;
}